

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O1

void __thiscall QStyleOptionTitleBar::QStyleOptionTitleBar(QStyleOptionTitleBar *this)

{
  QStyleOption::QStyleOption((QStyleOption *)this,1,0xf0005);
  (this->super_QStyleOptionComplex).subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = 0xffffffff;
  *(undefined8 *)&(this->super_QStyleOptionComplex).activeSubControls = 0;
  *(undefined8 *)((long)&(this->text).d.d + 4) = 0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  QIcon::QIcon(&this->icon);
  this->titleBarState = 0;
  this->titleBarFlags = (QFlagsStorageHelper<Qt::WindowType,_4>)0x0;
  return;
}

Assistant:

QStyleOptionTitleBar::QStyleOptionTitleBar()
    : QStyleOptionTitleBar(Version)
{
}